

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.cpp
# Opt level: O3

void duckdb_brotli::BrotliCreateHuffmanTree
               (uint32_t *data,size_t length,int tree_limit,HuffmanTree *tree,uint8_t *depth)

{
  uint uVar1;
  HuffmanTree HVar2;
  ulong uVar3;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  HuffmanTree *pHVar12;
  int iVar13;
  int16_t *piVar14;
  long lVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  
  uVar10 = 1;
  do {
    if (length == 0) {
LAB_0113b110:
      lVar6 = -1;
      tree->total_count_ = 0xffffffff;
      tree->index_left_ = -1;
      tree->index_right_or_value_ = -1;
      tree[1].total_count_ = 0xffffffff;
      tree[1].index_left_ = -1;
      tree[1].index_right_or_value_ = -1;
      lVar8 = 1;
      uVar3 = 0;
LAB_0113b1e0:
      lVar6 = -lVar6;
      lVar15 = 0;
      do {
        uVar1 = tree[lVar15].total_count_;
        uVar7 = tree[lVar8].total_count_;
        lVar17 = lVar15;
        if (uVar7 < uVar1) {
          lVar17 = lVar8;
        }
        lVar15 = lVar15 + (ulong)(uVar1 <= uVar7);
        lVar8 = lVar8 + (ulong)(uVar7 < uVar1);
        uVar1 = tree[lVar15].total_count_;
        uVar7 = tree[lVar8].total_count_;
        lVar18 = lVar15;
        if (uVar7 < uVar1) {
          lVar18 = lVar8;
        }
        lVar15 = lVar15 + (ulong)(uVar1 <= uVar7);
        lVar8 = lVar8 + (ulong)(uVar7 < uVar1);
        tree[uVar3 * 2 + lVar6].total_count_ = tree[lVar18].total_count_ + tree[lVar17].total_count_
        ;
        tree[uVar3 * 2 + lVar6].index_left_ = (int16_t)lVar17;
        tree[uVar3 * 2 + lVar6].index_right_or_value_ = (int16_t)lVar18;
        pHVar12 = tree + uVar3 * 2 + lVar6 + 1;
        pHVar12->total_count_ = 0xffffffff;
        pHVar12->index_left_ = -1;
        pHVar12->index_right_or_value_ = -1;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0);
      iVar13 = (int)uVar3 * 2 + -1;
    }
    else {
      uVar3 = 0;
      sVar4 = length;
      do {
        uVar7 = data[sVar4 - 1];
        if (uVar7 != 0) {
          if (uVar7 <= uVar10) {
            uVar7 = uVar10;
          }
          tree[uVar3].total_count_ = uVar7;
          tree[uVar3].index_left_ = -1;
          tree[uVar3].index_right_or_value_ = (short)sVar4 + -1;
          uVar3 = uVar3 + 1;
        }
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
      if (uVar3 == 1) {
        depth[tree->index_right_or_value_] = '\x01';
        return;
      }
      if (uVar3 < 0xd) {
        if (uVar3 == 0) goto LAB_0113b110;
        uVar5 = 1;
        do {
          HVar2 = tree[uVar5];
          uVar11 = uVar5;
          do {
            uVar9 = uVar11 - 1;
            if (tree[uVar11 - 1].total_count_ == HVar2.total_count_) {
              if (HVar2.index_right_or_value_ <= tree[uVar9].index_right_or_value_)
              goto LAB_0113b0ff;
            }
            else if (tree[uVar11 - 1].total_count_ <= HVar2.total_count_) goto LAB_0113b0ff;
            tree[uVar11] = tree[uVar9];
            uVar11 = uVar9;
          } while (uVar9 != 0);
          uVar11 = 0;
LAB_0113b0ff:
          tree[uVar11] = HVar2;
          uVar5 = uVar5 + 1;
        } while (uVar5 != uVar3);
      }
      else {
        uVar5 = (ulong)((uint)(uVar3 < 0x39) * 2);
        do {
          uVar11 = *(ulong *)(kBrotliShellGaps + uVar5 * 8);
          if (uVar11 < uVar3) {
            pHVar12 = tree + uVar11;
            uVar9 = uVar11;
            piVar14 = &tree->index_right_or_value_;
            do {
              HVar2 = tree[uVar9];
              uVar19 = uVar9;
              if (uVar11 <= uVar9) {
                lVar8 = 0;
                uVar16 = uVar9;
                do {
                  if (*(uint *)(piVar14 + lVar8 * 4 + -3) == HVar2.total_count_) {
                    if (HVar2.index_right_or_value_ <= piVar14[lVar8 * 4]) {
                      uVar19 = lVar8 + uVar9;
                      break;
                    }
                  }
                  else {
                    uVar19 = uVar16;
                    if (*(uint *)(piVar14 + lVar8 * 4 + -3) <= HVar2.total_count_) break;
                  }
                  uVar16 = uVar16 - uVar11;
                  pHVar12[lVar8] = *(HuffmanTree *)(piVar14 + lVar8 * 4 + -3);
                  lVar8 = lVar8 - uVar11;
                  uVar19 = uVar9 + lVar8;
                } while (uVar11 <= uVar19);
              }
              tree[uVar19] = HVar2;
              uVar9 = uVar9 + 1;
              piVar14 = piVar14 + 4;
              pHVar12 = pHVar12 + 1;
            } while (uVar9 != uVar3);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != 6);
      }
      pHVar12 = tree + uVar3;
      pHVar12->total_count_ = 0xffffffff;
      pHVar12->index_left_ = -1;
      pHVar12->index_right_or_value_ = -1;
      pHVar12 = tree + uVar3 + 1;
      pHVar12->total_count_ = 0xffffffff;
      pHVar12->index_left_ = -1;
      pHVar12->index_right_or_value_ = -1;
      lVar6 = uVar3 - 1;
      if (lVar6 != 0) {
        lVar8 = uVar3 + 1;
        goto LAB_0113b1e0;
      }
      iVar13 = 1;
    }
    iVar13 = BrotliSetDepth(iVar13,tree,depth,tree_limit);
    uVar10 = uVar10 * 2;
    if (iVar13 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void duckdb_brotli::BrotliCreateHuffmanTree(const uint32_t* data,
                             const size_t length,
                             const int tree_limit,
                             HuffmanTree* tree,
                             uint8_t* depth) {
  uint32_t count_limit;
  HuffmanTree sentinel;
  InitHuffmanTree(&sentinel, BROTLI_UINT32_MAX, -1, -1);
  /* For block sizes below 64 kB, we never need to do a second iteration
     of this loop. Probably all of our block sizes will be smaller than
     that, so this loop is mostly of academic interest. If we actually
     would need this, we would be better off with the Katajainen algorithm. */
  for (count_limit = 1; ; count_limit *= 2) {
    size_t n = 0;
    size_t i;
    size_t j;
    size_t k;
    for (i = length; i != 0;) {
      --i;
      if (data[i]) {
        const uint32_t count = BROTLI_MAX(uint32_t, data[i], count_limit);
        InitHuffmanTree(&tree[n++], count, -1, (int16_t)i);
      }
    }

    if (n == 1) {
      depth[tree[0].index_right_or_value_] = 1;  /* Only one element. */
      break;
    }

    SortHuffmanTreeItems(tree, n, SortHuffmanTree);

    /* The nodes are:
       [0, n): the sorted leaf nodes that we start with.
       [n]: we add a sentinel here.
       [n + 1, 2n): new parent nodes are added here, starting from
                    (n+1). These are naturally in ascending order.
       [2n]: we add a sentinel at the end as well.
       There will be (2n+1) elements at the end. */
    tree[n] = sentinel;
    tree[n + 1] = sentinel;

    i = 0;      /* Points to the next leaf node. */
    j = n + 1;  /* Points to the next non-leaf node. */
    for (k = n - 1; k != 0; --k) {
      size_t left, right;
      if (tree[i].total_count_ <= tree[j].total_count_) {
        left = i;
        ++i;
      } else {
        left = j;
        ++j;
      }
      if (tree[i].total_count_ <= tree[j].total_count_) {
        right = i;
        ++i;
      } else {
        right = j;
        ++j;
      }

      {
        /* The sentinel node becomes the parent node. */
        size_t j_end = 2 * n - k;
        tree[j_end].total_count_ =
            tree[left].total_count_ + tree[right].total_count_;
        tree[j_end].index_left_ = (int16_t)left;
        tree[j_end].index_right_or_value_ = (int16_t)right;

        /* Add back the last sentinel node. */
        tree[j_end + 1] = sentinel;
      }
    }
    if (BrotliSetDepth((int)(2 * n - 1), &tree[0], depth, tree_limit)) {
      /* We need to pack the Huffman tree in tree_limit bits. If this was not
         successful, add fake entities to the lowest values and retry. */
      break;
    }
  }
}